

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<short>,_ImPlot::TransformerLinLog>::operator()
          (StairsRenderer<ImPlot::GetterYs<short>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  int iVar7;
  ImU32 IVar8;
  GetterYs<short> *pGVar9;
  TransformerLinLog *pTVar10;
  ImPlotPlot *pIVar11;
  ImDrawVert *pIVar12;
  uint *puVar13;
  ImPlotContext *pIVar14;
  bool bVar15;
  double dVar16;
  ImVec2 IVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  pIVar14 = GImPlot;
  pGVar9 = this->Getter;
  dVar3 = pGVar9->XScale;
  dVar4 = pGVar9->X0;
  pTVar10 = this->Transformer;
  iVar7 = pGVar9->Count;
  dVar16 = log10((double)(int)*(short *)((long)pGVar9->Ys +
                                        (long)(((prim + 1 + pGVar9->Offset) % iVar7 + iVar7) % iVar7
                                              ) * (long)pGVar9->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar10->YAxis].Range.Min);
  iVar7 = pTVar10->YAxis;
  pIVar11 = pIVar14->CurrentPlot;
  dVar5 = pIVar11->YAxis[iVar7].Range.Min;
  IVar17.x = (float)((((double)(prim + 1) * dVar3 + dVar4) - (pIVar11->XAxis).Range.Min) *
                     pIVar14->Mx + (double)pIVar14->PixelRange[iVar7].Min.x);
  fVar18 = (float)((((double)(float)(dVar16 / pIVar14->LogDenY[iVar7]) *
                     (pIVar11->YAxis[iVar7].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar14->My[iVar7] + (double)pIVar14->PixelRange[iVar7].Min.y);
  fVar2 = (this->P1).x;
  fVar19 = (this->P1).y;
  fVar20 = fVar19;
  if (fVar18 <= fVar19) {
    fVar20 = fVar18;
  }
  bVar15 = false;
  if ((fVar20 < (cull_rect->Max).y) &&
     (fVar19 = (float)(-(uint)(fVar18 <= fVar19) & (uint)fVar19 |
                      ~-(uint)(fVar18 <= fVar19) & (uint)fVar18), pfVar1 = &(cull_rect->Min).y,
     bVar15 = false, *pfVar1 <= fVar19 && fVar19 != *pfVar1)) {
    fVar19 = fVar2;
    if (IVar17.x <= fVar2) {
      fVar19 = IVar17.x;
    }
    if (fVar19 < (cull_rect->Max).x) {
      fVar19 = (float)(~-(uint)(IVar17.x <= fVar2) & (uint)IVar17.x |
                      -(uint)(IVar17.x <= fVar2) & (uint)fVar2);
      bVar15 = (cull_rect->Min).x <= fVar19 && fVar19 != (cull_rect->Min).x;
    }
  }
  if (bVar15 != false) {
    fVar19 = (this->P1).y;
    fVar20 = fVar19 + this->HalfWeight;
    fVar19 = fVar19 - this->HalfWeight;
    IVar8 = this->Col;
    IVar6 = *uv;
    pIVar12 = DrawList->_VtxWritePtr;
    (pIVar12->pos).x = fVar2;
    (pIVar12->pos).y = fVar20;
    DrawList->_VtxWritePtr->uv = IVar6;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar8;
    pIVar12[1].pos.x = IVar17.x;
    pIVar12[1].pos.y = fVar19;
    DrawList->_VtxWritePtr[1].uv = IVar6;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar8;
    pIVar12[2].pos.x = fVar2;
    pIVar12[2].pos.y = fVar19;
    pIVar12[2].uv = IVar6;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar8;
    pIVar12[3].pos.x = IVar17.x;
    pIVar12[3].pos.y = fVar20;
    pIVar12[3].uv = IVar6;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar8;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    puVar13 = DrawList->_IdxWritePtr;
    *puVar13 = DrawList->_VtxCurrentIdx;
    puVar13[1] = DrawList->_VtxCurrentIdx + 1;
    puVar13[2] = DrawList->_VtxCurrentIdx + 2;
    puVar13[3] = DrawList->_VtxCurrentIdx;
    puVar13[4] = DrawList->_VtxCurrentIdx + 1;
    puVar13[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar13 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar20 = IVar17.x - this->HalfWeight;
    fVar19 = this->HalfWeight + IVar17.x;
    fVar2 = (this->P1).y;
    IVar8 = this->Col;
    IVar6 = *uv;
    pIVar12[4].pos.x = fVar20;
    pIVar12[4].pos.y = fVar18;
    DrawList->_VtxWritePtr->uv = IVar6;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar8;
    pIVar12[1].pos.x = fVar19;
    pIVar12[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar6;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar8;
    pIVar12[2].pos.x = fVar20;
    pIVar12[2].pos.y = fVar2;
    pIVar12[2].uv = IVar6;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar8;
    pIVar12[3].pos.x = fVar19;
    pIVar12[3].pos.y = fVar18;
    pIVar12[3].uv = IVar6;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar8;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    puVar13 = DrawList->_IdxWritePtr;
    *puVar13 = DrawList->_VtxCurrentIdx;
    puVar13[1] = DrawList->_VtxCurrentIdx + 1;
    puVar13[2] = DrawList->_VtxCurrentIdx + 2;
    puVar13[3] = DrawList->_VtxCurrentIdx;
    puVar13[4] = DrawList->_VtxCurrentIdx + 1;
    puVar13[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar13 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar17.y = fVar18;
  this->P1 = IVar17;
  return bVar15;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }